

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

Image * __thiscall
pbrt::Image::Crop(Image *__return_storage_ptr__,Image *this,Bounds2i *bounds,Allocator alloc)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Tuple2<pbrt::Point2,_int> p;
  Point2i resolution;
  int c;
  Point2i p_00;
  int iVar5;
  int iVar6;
  int iVar7;
  Float value;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  Bounds2iIterator BVar8;
  int va;
  int iStack_74;
  Bounds2i *local_70;
  int vb;
  Bounds2i *local_60;
  Bounds2i *local_58;
  ulong local_50;
  Tuple2<pbrt::Point2,_int> local_48;
  WrapMode2D local_40;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_38;
  
  uVar1 = (bounds->pMin).super_Tuple2<pbrt::Point2,_int>.x;
  uVar2 = (bounds->pMin).super_Tuple2<pbrt::Point2,_int>.y;
  vb = 0;
  iVar5 = (bounds->pMax).super_Tuple2<pbrt::Point2,_int>.y - uVar2;
  iVar7 = (bounds->pMax).super_Tuple2<pbrt::Point2,_int>.x - uVar1;
  iVar6 = iVar5 * iVar7;
  va = iVar6;
  local_60 = bounds;
  if (iVar6 < 1) {
    LogFatal<char_const(&)[14],char_const(&)[2],char_const(&)[14],int&,char_const(&)[2],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
               ,0x511,"Check failed: %s > %s with %s = %s, %s = %s",(char (*) [14])"bounds.Area()",
               (char (*) [2])0x2c92072,(char (*) [14])"bounds.Area()",&va,(char (*) [2])0x2c92072,
               &vb);
  }
  if (-1 < (int)(uVar2 | uVar1)) {
    local_38.bits =
         (this->encoding).
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         .bits;
    resolution.super_Tuple2<pbrt::Point2,_int>.y = iVar5;
    resolution.super_Tuple2<pbrt::Point2,_int>.x = iVar7;
    channels.n = (this->channelNames).nStored;
    channels.ptr = (this->channelNames).ptr;
    Image(__return_storage_ptr__,this->format,resolution,channels,(ColorEncodingHandle *)&local_38,
          alloc);
    _va = (local_60->pMin).super_Tuple2<pbrt::Point2,_int>;
    local_70 = local_60;
    BVar8 = pbrt::end(local_60);
    local_48 = (Tuple2<pbrt::Point2,_int>)BVar8.p.super_Tuple2<pbrt::Point2,_int>;
    local_50 = (ulong)local_48 >> 0x20;
    while (((p = _va, local_58 = BVar8.bounds, iVar5 = va, iVar6 = iStack_74,
            va != BVar8.p.super_Tuple2<pbrt::Point2,_int>.x || (iStack_74 != (int)local_50)) ||
           (local_70 != local_58))) {
      for (iVar7 = 0; iVar7 < (int)(this->channelNames).nStored; iVar7 = iVar7 + 1) {
        iVar3 = (local_60->pMin).super_Tuple2<pbrt::Point2,_int>.x;
        iVar4 = (local_60->pMin).super_Tuple2<pbrt::Point2,_int>.y;
        WrapMode2D::WrapMode2D(&local_40,Clamp);
        value = GetChannel(this,(Point2i)p,iVar7,local_40);
        p_00.super_Tuple2<pbrt::Point2,_int>.y = iVar6 - iVar4;
        p_00.super_Tuple2<pbrt::Point2,_int>.x = iVar5 - iVar3;
        SetChannel(__return_storage_ptr__,p_00,iVar7,value);
      }
      Bounds2iIterator::operator++((Bounds2iIterator *)&va);
      BVar8.bounds = local_58;
      BVar8.p.super_Tuple2<pbrt::Point2,_int> = local_48;
    }
    return __return_storage_ptr__;
  }
  LogFatal<char_const(&)[41]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
             ,0x512,"Check failed: %s",(char (*) [41])"bounds.pMin.x >= 0 && bounds.pMin.y >= 0");
}

Assistant:

Image Image::Crop(const Bounds2i &bounds, Allocator alloc) const {
    CHECK_GT(bounds.Area(), 0);
    CHECK(bounds.pMin.x >= 0 && bounds.pMin.y >= 0);
    Image image(format, Point2i(bounds.pMax - bounds.pMin), channelNames, encoding,
                alloc);
    for (Point2i p : bounds)
        for (int c = 0; c < NChannels(); ++c)
            image.SetChannel(Point2i(p - bounds.pMin), c, GetChannel(p, c));
    return image;
}